

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

PathTypeSetterSlotIndex * __thiscall
Js::PathTypeHandlerBase::UpdateSetterSlots
          (PathTypeHandlerBase *this,Recycler *recycler,PathTypeSetterSlotIndex *oldSetters,
          uint8 oldPathSize,uint8 newTypePathSize)

{
  uint16 uVar1;
  Recycler *this_00;
  byte *pbVar2;
  byte local_89;
  byte local_6f;
  byte local_6d;
  byte local_69;
  uint8 i_1;
  PathTypeSetterSlotIndex oldIndex;
  uint8 i;
  uint16 pathLength;
  uint8 initStart;
  TrackAllocData local_58;
  uchar *local_30;
  PathTypeSetterSlotIndex *newSetters;
  uint8 newTypePathSize_local;
  PathTypeSetterSlotIndex *pPStack_20;
  uint8 oldPathSize_local;
  PathTypeSetterSlotIndex *oldSetters_local;
  Recycler *recycler_local;
  PathTypeHandlerBase *this_local;
  
  newSetters._6_1_ = newTypePathSize;
  newSetters._7_1_ = oldPathSize;
  pPStack_20 = oldSetters;
  oldSetters_local = (PathTypeSetterSlotIndex *)recycler;
  recycler_local = (Recycler *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&unsigned_char::typeinfo,0,(ulong)newTypePathSize,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
             ,0x900);
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,&local_58);
  local_30 = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                       ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (ulong)newSetters._6_1_);
  if (pPStack_20 == (PathTypeSetterSlotIndex *)0x0) {
    local_69 = 0;
  }
  else {
    uVar1 = GetPathLength(this);
    pbVar2 = min<unsigned_char>((uchar *)((long)&newSetters + 6),(uchar *)((long)&newSetters + 7));
    local_69 = *pbVar2;
    for (local_6d = 0; local_6d < local_69; local_6d = local_6d + 1) {
      local_89 = pPStack_20[local_6d];
      if (uVar1 <= local_89) {
        local_89 = 0xff;
      }
      local_30[local_6d] = local_89;
    }
  }
  for (local_6f = local_69; local_6f < newSetters._6_1_; local_6f = local_6f + 1) {
    local_30[local_6f] = 0xff;
  }
  return local_30;
}

Assistant:

PathTypeSetterSlotIndex * PathTypeHandlerBase::UpdateSetterSlots(Recycler * recycler, PathTypeSetterSlotIndex * oldSetters, uint8 oldPathSize, uint8 newTypePathSize)
    {
        PathTypeSetterSlotIndex * newSetters = RecyclerNewArrayLeaf(recycler, PathTypeSetterSlotIndex, newTypePathSize);
        uint8 initStart;
        if (oldSetters == nullptr)
        {
            initStart = 0;
        }
        else
        {
            uint16 pathLength = GetPathLength();
            // In branching cases, the new type path may be shorter than the old.
            initStart = min(newTypePathSize, oldPathSize);
            for (uint8 i = 0; i < initStart; i++)
            {
                // Only copy setter indices that refer to the part of the path contained by this handler already.
                // Otherwise, wait for the correct index, which may be different on this path of the branch,
                // to be set when the setter property is added to the handler.
                PathTypeSetterSlotIndex oldIndex = oldSetters[i];
                newSetters[i] = oldIndex < pathLength ? oldIndex : NoSetterSlot;
            }
        }
        for (uint8 i = initStart; i < newTypePathSize; i++)
        {
            newSetters[i] = NoSetterSlot;
        }

        return newSetters;
    }